

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

void __thiscall
despot::SimpleRockSample::PrintObs
          (SimpleRockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  ostream *this_00;
  char *pcVar1;
  ostream *out_local;
  OBS_TYPE observation_local;
  State *state_local;
  SimpleRockSample *this_local;
  
  pcVar1 = "BAD";
  if (observation != 0) {
    pcVar1 = "GOOD";
  }
  this_00 = std::operator<<(out,pcVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SimpleRockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	out << (observation ? "GOOD" : "BAD") << endl;
}